

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

void __thiscall lsh::table::table(table *this,brute *c)

{
  ulong __n;
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  local_b8;
  allocator<bool> local_69;
  vector<bool,_std::allocator<bool>_> local_68;
  vector local_40;
  uint local_1c;
  brute *pbStack_18;
  uint d;
  brute *c_local;
  table *this_local;
  
  pbStack_18 = c;
  c_local = (brute *)this;
  std::
  unordered_map<unsigned_int,_lsh::vector,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsh::vector>_>_>
  ::unordered_map(&this->vectors_);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::vector(&this->masks_);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::vector(&this->partitions_);
  local_1c = pbStack_18->dimensions;
  this->dimensions_ = local_1c;
  __n = (ulong)local_1c;
  std::allocator<bool>::allocator(&local_69);
  std::vector<bool,_std::allocator<bool>_>::vector(&local_68,__n,&local_69);
  lsh::vector::vector(&local_40,&local_68);
  std::vector<lsh::vector,_std::allocator<lsh::vector>_>::push_back(&this->masks_,&local_40);
  lsh::vector::~vector(&local_40);
  std::vector<bool,_std::allocator<bool>_>::~vector(&local_68);
  std::allocator<bool>::~allocator(&local_69);
  local_b8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_b8._M_h._M_rehash_policy._4_4_ = 0;
  local_b8._M_h._M_rehash_policy._M_next_resize = 0;
  local_b8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b8._M_h._M_element_count = 0;
  local_b8._M_h._M_buckets = (__buckets_ptr)0x0;
  local_b8._M_h._M_bucket_count = 0;
  local_b8._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::unordered_map(&local_b8);
  std::
  vector<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::allocator<std::unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::push_back(&this->partitions_,&local_b8);
  std::
  unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~unordered_map(&local_b8);
  return;
}

Assistant:

table::table(const brute& c) {
    unsigned int d = c.dimensions;

    this->dimensions_ = d;
    this->masks_.push_back(vector(std::vector<bool>(d)));
    this->partitions_.push_back(partition());
  }